

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O3

void iCopyPaletted<cBGRA,bReverseSubtract>
               (BYTE *buffer,BYTE *patch,int srcwidth,int srcheight,int Pitch,int step_x,int step_y,
               int rotate,PalEntry *palette,FCopyInfo *inf)

{
  byte bVar1;
  BYTE BVar2;
  int iVar3;
  int iVar4;
  byte *pbVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  
  if (0 < srcheight) {
    uVar7 = 0;
    iVar3 = 0;
    do {
      if (0 < srcwidth) {
        lVar8 = (long)iVar3;
        uVar6 = 0;
        pbVar5 = patch;
        do {
          bVar1 = *pbVar5;
          BVar2 = palette[bVar1].field_0.field_0.a;
          if (BVar2 != '\0') {
            iVar4 = (uint)palette[bVar1].field_0.field_0.r * inf->alpha +
                    (uint)buffer[uVar6 * 4 + lVar8 + 2] * -0x10000;
            if (iVar4 >> 0x10 < 1) {
              iVar4 = 0;
            }
            buffer[uVar6 * 4 + lVar8 + 2] = (BYTE)((uint)iVar4 >> 0x10);
            iVar4 = (uint)palette[bVar1].field_0.field_0.g * inf->alpha +
                    (uint)buffer[uVar6 * 4 + lVar8 + 1] * -0x10000;
            if (iVar4 >> 0x10 < 1) {
              iVar4 = 0;
            }
            buffer[uVar6 * 4 + lVar8 + 1] = (BYTE)((uint)iVar4 >> 0x10);
            iVar4 = (uint)palette[bVar1].field_0.field_0.b * inf->alpha +
                    (uint)buffer[uVar6 * 4 + lVar8] * -0x10000;
            if (iVar4 >> 0x10 < 1) {
              iVar4 = 0;
            }
            buffer[uVar6 * 4 + lVar8] = (BYTE)((uint)iVar4 >> 0x10);
            buffer[uVar6 * 4 + lVar8 + 3] = BVar2;
          }
          uVar6 = uVar6 + 1;
          pbVar5 = pbVar5 + step_x;
        } while ((uint)srcwidth != uVar6);
      }
      uVar7 = uVar7 + 1;
      iVar3 = iVar3 + Pitch;
      patch = patch + step_y;
    } while (uVar7 != (uint)srcheight);
  }
  return;
}

Assistant:

void iCopyPaletted(BYTE *buffer, const BYTE * patch, int srcwidth, int srcheight, int Pitch,
					int step_x, int step_y, int rotate, PalEntry * palette, FCopyInfo *inf)
{
	int x,y,pos;

	for (y=0;y<srcheight;y++)
	{
		pos = y*Pitch;
		for (x=0;x<srcwidth;x++,pos+=4)
		{
			int v=(unsigned char)patch[y*step_y+x*step_x];
			int a = palette[v].a;

			if (TBlend::ProcessAlpha0() || a)
			{
				TBlend::OpC(buffer[pos + TDest::RED], palette[v].r, a, inf);
				TBlend::OpC(buffer[pos + TDest::GREEN], palette[v].g, a, inf);
				TBlend::OpC(buffer[pos + TDest::BLUE], palette[v].b, a, inf);
				TBlend::OpA(buffer[pos + TDest::ALPHA], a, inf);
			}
		}
	}
}